

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

void __thiscall
chaiscript::eval::
Inline_Array_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
Inline_Array_AST_Node
          (Inline_Array_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,string *t_ast_node_text,Parse_Location *t_loc,
          vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
          *t_children)

{
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  local_80;
  Parse_Location local_68;
  string local_48;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  *local_28;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  *t_children_local;
  Parse_Location *t_loc_local;
  string *t_ast_node_text_local;
  Inline_Array_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_local
  ;
  
  local_28 = t_children;
  t_children_local =
       (vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
        *)t_loc;
  t_loc_local = (Parse_Location *)t_ast_node_text;
  t_ast_node_text_local = (string *)this;
  std::__cxx11::string::string((string *)&local_48,t_ast_node_text);
  Parse_Location::Parse_Location(&local_68,t_loc);
  std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  ::vector(&local_80,t_children);
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::AST_Node_Impl
            (&this->
              super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,
             &local_48,Inline_Array,&local_68,&local_80);
  std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  ::~vector(&local_80);
  Parse_Location::~Parse_Location(&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
  super_AST_Node._vptr_AST_Node = (_func_int **)&PTR_get_children_008761d0;
  std::atomic<unsigned_long>::atomic(&this->m_loc,0);
  return;
}

Assistant:

Inline_Array_AST_Node(std::string t_ast_node_text, Parse_Location t_loc, std::vector<AST_Node_Impl_Ptr<T>> t_children)
          : AST_Node_Impl<T>(std::move(t_ast_node_text), AST_Node_Type::Inline_Array, std::move(t_loc), std::move(t_children)) {
      }